

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

double ON_SolveNxN(bool bFullPivot,bool bNormalize,int n,double **M,double *B,double *X)

{
  undefined4 uVar1;
  double *pdVar2;
  double dVar3;
  double *local_178;
  double *local_170;
  int *Xdex;
  double *p;
  double maxpivot;
  double minpivot;
  double x;
  int Xdex_buffer [64];
  int local_40;
  int n0;
  int maxj;
  int maxi;
  int j;
  int i;
  double *X_local;
  double *B_local;
  double **M_local;
  int n_local;
  bool bNormalize_local;
  bool bFullPivot_local;
  
  if ((((n < 1) || (M == (double **)0x0)) || (B == (double *)0x0)) || (X == (double *)0x0)) {
    _n_local = 0.0;
  }
  else {
    maxpivot = 0.0;
    p = (double *)0x3ff0000000000000;
    local_170 = (double *)0x0;
    if (bNormalize) {
      for (maxi = 0; maxi < n; maxi = maxi + 1) {
        minpivot = 0.0;
        for (maxj = 0; maxj < n; maxj = maxj + 1) {
          minpivot = M[maxi][maxj] * M[maxi][maxj] + minpivot;
        }
        if (0.0 < minpivot) {
          dVar3 = sqrt(minpivot);
          B[maxi] = (1.0 / dVar3) * B[maxi];
          for (maxj = 0; maxj < n; maxj = maxj + 1) {
            M[maxi][maxj] = (1.0 / dVar3) * M[maxi][maxj];
          }
        }
      }
    }
    if (bFullPivot) {
      if (n < 0x41) {
        local_178 = &x;
      }
      else {
        local_178 = (double *)onmalloc((long)n << 2);
      }
      local_170 = local_178;
      for (maxi = 0; maxi < n; maxi = maxi + 1) {
        *(int *)((long)local_178 + (long)maxi * 4) = maxi;
      }
    }
    for (Xdex_buffer[0x3f] = 0; Xdex_buffer[0x3f] < n; Xdex_buffer[0x3f] = Xdex_buffer[0x3f] + 1) {
      n0 = Xdex_buffer[0x3f];
      local_40 = Xdex_buffer[0x3f];
      minpivot = 0.0;
      for (maxj = Xdex_buffer[0x3f]; maxj < n; maxj = maxj + 1) {
        for (maxi = Xdex_buffer[0x3f]; maxi < n; maxi = maxi + 1) {
          if (minpivot < (double)((ulong)M[maxi][maxj] & (ulong)DAT_009d3010)) {
            minpivot = (double)((ulong)M[maxi][maxj] & (ulong)DAT_009d3010);
            n0 = maxi;
            local_40 = maxj;
          }
        }
        if (!bFullPivot) break;
      }
      if ((minpivot == 0.0) && (!NAN(minpivot))) {
        if ((local_170 != (double *)0x0) && (local_170 != &x)) {
          onfree(local_170);
        }
        return (double)-Xdex_buffer[0x3f];
      }
      if (Xdex_buffer[0x3f] == 0) {
        maxpivot = minpivot;
        p = (double *)minpivot;
      }
      else if (maxpivot <= minpivot) {
        if ((double)p < minpivot) {
          p = (double *)minpivot;
        }
      }
      else {
        maxpivot = minpivot;
      }
      if (Xdex_buffer[0x3f] != n0) {
        pdVar2 = M[Xdex_buffer[0x3f]];
        M[Xdex_buffer[0x3f]] = M[n0];
        M[n0] = pdVar2;
        dVar3 = B[Xdex_buffer[0x3f]];
        B[Xdex_buffer[0x3f]] = B[n0];
        B[n0] = dVar3;
      }
      if (Xdex_buffer[0x3f] != local_40) {
        for (maxi = 0; maxi < n; maxi = maxi + 1) {
          dVar3 = M[maxi][Xdex_buffer[0x3f]];
          M[maxi][Xdex_buffer[0x3f]] = M[maxi][local_40];
          M[maxi][local_40] = dVar3;
        }
        uVar1 = *(undefined4 *)((long)local_170 + (long)Xdex_buffer[0x3f] * 4);
        *(undefined4 *)((long)local_170 + (long)Xdex_buffer[0x3f] * 4) =
             *(undefined4 *)((long)local_170 + (long)local_40 * 4);
        *(undefined4 *)((long)local_170 + (long)local_40 * 4) = uVar1;
      }
      dVar3 = M[Xdex_buffer[0x3f]][Xdex_buffer[0x3f]];
      B[Xdex_buffer[0x3f]] = (1.0 / dVar3) * B[Xdex_buffer[0x3f]];
      maxj = Xdex_buffer[0x3f];
      while (maxj = maxj + 1, maxi = Xdex_buffer[0x3f], maxj < n) {
        M[Xdex_buffer[0x3f]][maxj] = (1.0 / dVar3) * M[Xdex_buffer[0x3f]][maxj];
      }
      while (maxi = maxi + 1, maxi < n) {
        dVar3 = -M[maxi][Xdex_buffer[0x3f]];
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          B[maxi] = dVar3 * B[Xdex_buffer[0x3f]] + B[maxi];
          maxj = Xdex_buffer[0x3f];
          while (maxj = maxj + 1, maxj < n) {
            M[maxi][maxj] = dVar3 * M[Xdex_buffer[0x3f]][maxj] + M[maxi][maxj];
          }
        }
      }
    }
    for (maxj = n + -1; -1 < maxj; maxj = maxj + -1) {
      for (maxi = 0; maxi < maxj; maxi = maxi + 1) {
        dVar3 = -M[maxi][maxj];
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          B[maxi] = dVar3 * B[maxj] + B[maxi];
        }
      }
    }
    if (bFullPivot) {
      for (maxi = 0; maxi < n; maxi = maxi + 1) {
        X[*(int *)((long)local_170 + (long)maxi * 4)] = B[maxi];
      }
      if ((local_170 != (double *)0x0) && (local_170 != &x)) {
        onfree(local_170);
      }
    }
    else {
      memcpy(X,B,(long)n << 3);
    }
    _n_local = maxpivot / (double)p;
  }
  return _n_local;
}

Assistant:

double ON_SolveNxN(bool bFullPivot, bool bNormalize, int n, double* M[], double B[], double X[])
{
  if ( n <= 0 || 0 == M || 0 == B || 0 == X )
    return 0.0;

  int i,j,maxi,maxj,n0, Xdex_buffer[64];
  double x,minpivot=0.0,maxpivot=1.0,*p;
  int* Xdex = 0;
  
  if ( bNormalize )
  {
    for ( i = 0; i < n; i++ )
    {
      x = 0.0;
      for ( j = 0; j < n; j++ )
      {
        x += M[i][j]*M[i][j];
      }
      if ( x > 0.0 )
      {
        x = 1.0/sqrt(x);
        B[i] *= x;
        for ( j = 0; j < n; j++ )
          M[i][j] *= x;
      }
    }
  }

  if ( bFullPivot )
  {
    // The Xdex_buffer[] hoo haa is here to avoid an potentially time
    // consuming call to heap services when the matrix is small.
    // When n > 64 the numerical portion of the computation is 
    // long enough that the time to call onmalloc() is negligible.
    // (When n > 10-ish, this calculation is likely to return junk
    // unless you have a special case matrix, in which case this
    // function will be much slower than one that is designed to
    // takes advantage of the special case.
    Xdex = (n <= (int)((sizeof(Xdex_buffer)/sizeof(Xdex_buffer[0]))))
         ? &Xdex_buffer[0] 
         : (int*)onmalloc(n*sizeof(Xdex[0]));
    for ( i = 0; i < n; i++ )
      Xdex[i] = i;
  }

  // reduce system of equations to upper triangular
  for (n0=0; n0<n; n0++)
  {
    // find pivot = biggest entry in sub-matrix
    maxi=n0;
    maxj=n0;
    x=0.0;
    for(j=n0;j<n;j++) 
    {
      for(i=n0;i<n;i++)  
      {
        if ( fabs(M[i][j]) > x )
        {
          x=fabs(M[i][j]);
          maxi=i;
          maxj=j;
        }
      }
      if ( !bFullPivot )
        break;
    }
    if ( 0.0==x )
    {
      // system of equations is degenerate
      // Return -(rank of M) (M has rank n0)
      if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
        onfree(Xdex);
      return -n0;
    }
    else if ( 0==n0 )
    {
      minpivot=x;
      maxpivot=x;
    }
    else if (x < minpivot)
      minpivot=x;
    else if  (x > maxpivot)
      maxpivot=x;

    // put pivot in M[n0][n0]
    if ( n0 != maxi )
    {
      // swap rows n0 and maxi
      p = M[n0];M[n0]=M[maxi];M[maxi]=p;
      x=B[n0];B[n0]=B[maxi];B[maxi]=x;
    }
    if ( n0 != maxj )
    {
      // swap columns n0 and maxj
      for (i=0;i<n;i++)
      {
        x=M[i][n0];M[i][n0]=M[i][maxj];M[i][maxj]=x;
      }
      j=Xdex[n0];Xdex[n0]=Xdex[maxj];Xdex[maxj]=j;
    }

    // divide row n0 by M[n0][n0] to unitize M[n0][n0]
    x = 1.0/M[n0][n0];
    //M[n0][n0] = 1.0; // cosmetic because M[n0][n0] will never be used again
    B[n0] *= x;
    for (j=n0+1;j<n;j++) 
      M[n0][j] *= x;

    // For each i > n0, replace row[i] with
    // row[i] - M[i][n0]*row[n0] to zero out M[i>n0][n0]
    for ( i = n0+1; i < n; i++ )
    {
      x = -M[i][n0];
      if ( 0.0 != x )
      {
        //M[i][n0] = 0.0; // cosmetic because M[i][n0] will never be used again
        B[i] += x*B[n0];
        for ( j = n0+1; j < n; j++ )
        {
          M[i][j] += x*M[n0][j];
        }
      }
    }
  }

  // At this point M is upper triangular with 1's
  // on its diagonal.  Backsolve.
  for ( j = n-1; j >= 0; j-- )
  {
    for ( i = 0; i < j; i++ )
    {
      x = -M[i][j];
      if ( x != 0 )
      {
        B[i] += x*B[j];
        //M[i][j] += x; // cosmetic because M[i][j] will never be used again
      }
    }
  }

  // solution is now in B
  if ( bFullPivot )
  {
    for(i=0;i<n;i++)
      X[Xdex[i]] = B[i];

    if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
      onfree(Xdex);
  }
  else
  {
    memcpy(&X[0],&B[0],n*sizeof(X[0]));
  }

  return minpivot/maxpivot;
}